

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkcs7_test.cc
# Opt level: O2

void __thiscall PKCS7Test_SortCRLs_Test::TestBody(PKCS7Test_SortCRLs_Test *this)

{
  BIO *__p;
  char *in_R9;
  UniquePtr<X509_CRL> crl2;
  AssertHelper local_60;
  UniquePtr<X509_CRL> crl1;
  UniquePtr<BIO> bio;
  anon_class_16_2_3ef3a31a check_order;
  AssertHelper local_28;
  AssertionResult gtest_ar_;
  
  bio._M_t.super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.super__Head_base<0UL,_bio_st_*,_false>.
  _M_head_impl = (__uniq_ptr_data<bio_st,_bssl::internal::Deleter,_true,_true>)
                 BIO_new_mem_buf("\n-----BEGIN X509 CRL-----\nMIIBpzCBkAIBATANBgkqhkiG9w0BAQsFADBOMQswCQYDVQQGEwJVUzETMBEGA1UE\nCAwKQ2FsaWZvcm5pYTEWMBQGA1UEBwwNTW91bnRhaW4gVmlldzESMBAGA1UECgwJ\nQm9yaW5nU1NMFw0xNjA5MjYxNTEwNTVaFw0xNjEwMjYxNTEwNTVaoA4wDDAKBgNV\nHRQEAwIBATANBgkqhkiG9w0BAQsFAAOCAQEAnrBKKgvd9x9zwK9rtUvVeFeJ7+LN\nZEAc+a5oxpPNEsJx6hXoApYEbzXMxuWBQoCs5iEBycSGudct21L+MVf27M38KrWo\neOkq0a2siqViQZO2Fb/SUFR0k9zb8xl86Zf65lgPplALun0bV/HT7MJcl04Tc4os\ndsAReBs5nqTGNEd5AlC1iKHvQZkM//MD51DspKnDpsDiUVi54h9C1SpfZmX8H2Vv\ndiyu0fZ/bPAM3VAGawatf/SyWfBMyKpoPXEG39oAzmjjOj8en82psn7m474IGaho\n/vBbhl1ms5qQiLYPjm4YELtnXQoFyC72tBjbdFd/ZE9k4CNKDbxFUXFbkw==\n-----END X509 CRL-----\n"
                                 ,0x276);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar_.success_ =
       (tuple<bio_st_*,_bssl::internal::Deleter>)
       bio._M_t.super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>._M_t.
       super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.
       super__Head_base<0UL,_bio_st_*,_false>._M_head_impl != (_Head_base<0UL,_bio_st_*,_false>)0x0;
  if ((tuple<bio_st_*,_bssl::internal::Deleter>)
      bio._M_t.super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_bio_st_*,_false>._M_head_impl == (_Head_base<0UL,_bio_st_*,_false>)0x0)
  {
    testing::Message::Message((Message *)&crl1);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&check_order,(internal *)&gtest_ar_,(AssertionResult *)0x5104cb,"false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&crl2,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs7/pkcs7_test.cc"
               ,0x19d,(char *)check_order.crl1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&crl2,(Message *)&crl1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&crl2);
    std::__cxx11::string::~string((string *)&check_order);
    if ((__uniq_ptr_impl<X509_crl_st,_bssl::internal::Deleter>)
        crl1._M_t.super___uniq_ptr_impl<X509_crl_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_X509_crl_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_X509_crl_st_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<X509_crl_st,_bssl::internal::Deleter>)0x0) {
      (**(code **)(*(long *)crl1._M_t.super___uniq_ptr_impl<X509_crl_st,_bssl::internal::Deleter>.
                            _M_t.super__Tuple_impl<0UL,_X509_crl_st_*,_bssl::internal::Deleter>.
                            super__Head_base<0UL,_X509_crl_st_*,_false>._M_head_impl + 8))();
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    goto LAB_002f8f88;
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  crl1._M_t.super___uniq_ptr_impl<X509_crl_st,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_X509_crl_st_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_X509_crl_st_*,_false>._M_head_impl =
       (__uniq_ptr_data<X509_crl_st,_bssl::internal::Deleter,_true,_true>)
       PEM_read_bio_X509_CRL
                 ((BIO *)bio._M_t.super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>._M_t.
                         super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.
                         super__Head_base<0UL,_bio_st_*,_false>._M_head_impl,(X509_CRL **)0x0,
                  (undefined1 *)0x0,(void *)0x0);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar_.success_ =
       (tuple<X509_crl_st_*,_bssl::internal::Deleter>)
       crl1._M_t.super___uniq_ptr_impl<X509_crl_st,_bssl::internal::Deleter>._M_t.
       super__Tuple_impl<0UL,_X509_crl_st_*,_bssl::internal::Deleter>.
       super__Head_base<0UL,_X509_crl_st_*,_false>._M_head_impl !=
       (_Head_base<0UL,_X509_crl_st_*,_false>)0x0;
  if ((tuple<X509_crl_st_*,_bssl::internal::Deleter>)
      crl1._M_t.super___uniq_ptr_impl<X509_crl_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_X509_crl_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_X509_crl_st_*,_false>._M_head_impl ==
      (_Head_base<0UL,_X509_crl_st_*,_false>)0x0) {
    testing::Message::Message((Message *)&crl2);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&check_order,(internal *)&gtest_ar_,(AssertionResult *)"crl1","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs7/pkcs7_test.cc"
               ,0x1a0,(char *)check_order.crl1);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&crl2);
LAB_002f8ebf:
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    std::__cxx11::string::~string((string *)&check_order);
    if ((__uniq_ptr_impl<X509_crl_st,_bssl::internal::Deleter>)
        crl2._M_t.super___uniq_ptr_impl<X509_crl_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_X509_crl_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_X509_crl_st_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<X509_crl_st,_bssl::internal::Deleter>)0x0) {
      (**(code **)(*(long *)crl2._M_t.super___uniq_ptr_impl<X509_crl_st,_bssl::internal::Deleter>.
                            _M_t.super__Tuple_impl<0UL,_X509_crl_st_*,_bssl::internal::Deleter>.
                            super__Head_base<0UL,_X509_crl_st_*,_false>._M_head_impl + 8))();
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    __p = BIO_new_mem_buf("\n-----BEGIN X509 CRL-----\nMIIBvjCBpwIBATANBgkqhkiG9w0BAQsFADBOMQswCQYDVQQGEwJVUzETMBEGA1UE\nCAwKQ2FsaWZvcm5pYTEWMBQGA1UEBwwNTW91bnRhaW4gVmlldzESMBAGA1UECgwJ\nQm9yaW5nU1NMFw0xNjA5MjYxNTEyNDRaFw0xNjEwMjYxNTEyNDRaMBUwEwICEAAX\nDTE2MDkyNjE1MTIyNlqgDjAMMAoGA1UdFAQDAgECMA0GCSqGSIb3DQEBCwUAA4IB\nAQCUGaM4DcWzlQKrcZvI8TMeR8BpsvQeo5BoI/XZu2a8h//PyRyMwYeaOM+3zl0d\nsjgCT8b3C1FPgT+P2Lkowv7rJ+FHJRNQkogr+RuqCSPTq65ha4WKlRGWkMFybzVH\nNloxC+aU3lgp/NlX9yUtfqYmJek1CDrOOGPrAEAwj1l/BUeYKNGqfBWYJQtPJu+5\nOaSvIYGpETCZJscUWODmLEb/O3DM438vLvxonwGqXqS0KX37+CHpUlyhnSovxXxp\nPz4aF+L7OtczxL0GYtD2fR9B7TDMqsNmHXgQrixvvOY7MUdLGbd4RfJL3yA53hyO\nxzfKY2TzxLiOmctG0hXFkH5J\n-----END X509 CRL-----\n"
                          ,0x293);
    std::__uniq_ptr_impl<bio_st,_bssl::internal::Deleter>::reset
              ((__uniq_ptr_impl<bio_st,_bssl::internal::Deleter> *)&bio,(pointer)__p);
    gtest_ar_.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    gtest_ar_.success_ =
         (__uniq_ptr_impl<bio_st,_bssl::internal::Deleter>)
         bio._M_t.super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>._M_t.
         super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.
         super__Head_base<0UL,_bio_st_*,_false>._M_head_impl !=
         (__uniq_ptr_impl<bio_st,_bssl::internal::Deleter>)0x0;
    if ((__uniq_ptr_impl<bio_st,_bssl::internal::Deleter>)
        bio._M_t.super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_bio_st_*,_false>._M_head_impl ==
        (__uniq_ptr_impl<bio_st,_bssl::internal::Deleter>)0x0) {
      testing::Message::Message((Message *)&crl2);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&check_order,(internal *)&gtest_ar_,(AssertionResult *)0x5104cb,"false",
                 "true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_60,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs7/pkcs7_test.cc"
                 ,0x1a2,(char *)check_order.crl1);
      testing::internal::AssertHelper::operator=(&local_60,(Message *)&crl2);
      goto LAB_002f8ebf;
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    crl2._M_t.super___uniq_ptr_impl<X509_crl_st,_bssl::internal::Deleter>._M_t.
    super__Tuple_impl<0UL,_X509_crl_st_*,_bssl::internal::Deleter>.
    super__Head_base<0UL,_X509_crl_st_*,_false>._M_head_impl =
         (__uniq_ptr_data<X509_crl_st,_bssl::internal::Deleter,_true,_true>)
         PEM_read_bio_X509_CRL
                   ((BIO *)bio._M_t.super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>._M_t.
                           super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.
                           super__Head_base<0UL,_bio_st_*,_false>._M_head_impl,(X509_CRL **)0x0,
                    (undefined1 *)0x0,(void *)0x0);
    gtest_ar_.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    gtest_ar_.success_ =
         (tuple<X509_crl_st_*,_bssl::internal::Deleter>)
         crl2._M_t.super___uniq_ptr_impl<X509_crl_st,_bssl::internal::Deleter>._M_t.
         super__Tuple_impl<0UL,_X509_crl_st_*,_bssl::internal::Deleter>.
         super__Head_base<0UL,_X509_crl_st_*,_false>._M_head_impl !=
         (_Head_base<0UL,_X509_crl_st_*,_false>)0x0;
    if ((tuple<X509_crl_st_*,_bssl::internal::Deleter>)
        crl2._M_t.super___uniq_ptr_impl<X509_crl_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_X509_crl_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_X509_crl_st_*,_false>._M_head_impl ==
        (_Head_base<0UL,_X509_crl_st_*,_false>)0x0) {
      testing::Message::Message((Message *)&local_60);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&check_order,(internal *)&gtest_ar_,(AssertionResult *)0x4fb20c,"false",
                 "true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_28,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs7/pkcs7_test.cc"
                 ,0x1a5,(char *)check_order.crl1);
      testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_60);
      testing::internal::AssertHelper::~AssertHelper(&local_28);
      std::__cxx11::string::~string((string *)&check_order);
      if (local_60.data_ != (AssertHelperData *)0x0) {
        (**(code **)(*(long *)local_60.data_ + 8))();
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar_.message_);
    }
    else {
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar_.message_);
      check_order.crl1 = &crl1;
      check_order.crl2 = &crl2;
      TestBody::anon_class_16_2_3ef3a31a::operator()
                (&check_order,
                 (X509_CRL *)
                 crl1._M_t.super___uniq_ptr_impl<X509_crl_st,_bssl::internal::Deleter>._M_t.
                 super__Tuple_impl<0UL,_X509_crl_st_*,_bssl::internal::Deleter>.
                 super__Head_base<0UL,_X509_crl_st_*,_false>._M_head_impl,
                 (X509_CRL *)
                 crl2._M_t.super___uniq_ptr_impl<X509_crl_st,_bssl::internal::Deleter>._M_t.
                 super__Tuple_impl<0UL,_X509_crl_st_*,_bssl::internal::Deleter>.
                 super__Head_base<0UL,_X509_crl_st_*,_false>._M_head_impl);
      TestBody::anon_class_16_2_3ef3a31a::operator()
                (&check_order,
                 (X509_CRL *)
                 crl2._M_t.super___uniq_ptr_impl<X509_crl_st,_bssl::internal::Deleter>._M_t.
                 super__Tuple_impl<0UL,_X509_crl_st_*,_bssl::internal::Deleter>.
                 super__Head_base<0UL,_X509_crl_st_*,_false>._M_head_impl,
                 (X509_CRL *)
                 crl1._M_t.super___uniq_ptr_impl<X509_crl_st,_bssl::internal::Deleter>._M_t.
                 super__Tuple_impl<0UL,_X509_crl_st_*,_bssl::internal::Deleter>.
                 super__Head_base<0UL,_X509_crl_st_*,_false>._M_head_impl);
    }
    std::unique_ptr<X509_crl_st,_bssl::internal::Deleter>::~unique_ptr(&crl2);
  }
  std::unique_ptr<X509_crl_st,_bssl::internal::Deleter>::~unique_ptr(&crl1);
LAB_002f8f88:
  std::unique_ptr<bio_st,_bssl::internal::Deleter>::~unique_ptr(&bio);
  return;
}

Assistant:

TEST(PKCS7Test, SortCRLs) {
  static const char kCRL1[] = R"(
-----BEGIN X509 CRL-----
MIIBpzCBkAIBATANBgkqhkiG9w0BAQsFADBOMQswCQYDVQQGEwJVUzETMBEGA1UE
CAwKQ2FsaWZvcm5pYTEWMBQGA1UEBwwNTW91bnRhaW4gVmlldzESMBAGA1UECgwJ
Qm9yaW5nU1NMFw0xNjA5MjYxNTEwNTVaFw0xNjEwMjYxNTEwNTVaoA4wDDAKBgNV
HRQEAwIBATANBgkqhkiG9w0BAQsFAAOCAQEAnrBKKgvd9x9zwK9rtUvVeFeJ7+LN
ZEAc+a5oxpPNEsJx6hXoApYEbzXMxuWBQoCs5iEBycSGudct21L+MVf27M38KrWo
eOkq0a2siqViQZO2Fb/SUFR0k9zb8xl86Zf65lgPplALun0bV/HT7MJcl04Tc4os
dsAReBs5nqTGNEd5AlC1iKHvQZkM//MD51DspKnDpsDiUVi54h9C1SpfZmX8H2Vv
diyu0fZ/bPAM3VAGawatf/SyWfBMyKpoPXEG39oAzmjjOj8en82psn7m474IGaho
/vBbhl1ms5qQiLYPjm4YELtnXQoFyC72tBjbdFd/ZE9k4CNKDbxFUXFbkw==
-----END X509 CRL-----
)";
  static const char kCRL2[] = R"(
-----BEGIN X509 CRL-----
MIIBvjCBpwIBATANBgkqhkiG9w0BAQsFADBOMQswCQYDVQQGEwJVUzETMBEGA1UE
CAwKQ2FsaWZvcm5pYTEWMBQGA1UEBwwNTW91bnRhaW4gVmlldzESMBAGA1UECgwJ
Qm9yaW5nU1NMFw0xNjA5MjYxNTEyNDRaFw0xNjEwMjYxNTEyNDRaMBUwEwICEAAX
DTE2MDkyNjE1MTIyNlqgDjAMMAoGA1UdFAQDAgECMA0GCSqGSIb3DQEBCwUAA4IB
AQCUGaM4DcWzlQKrcZvI8TMeR8BpsvQeo5BoI/XZu2a8h//PyRyMwYeaOM+3zl0d
sjgCT8b3C1FPgT+P2Lkowv7rJ+FHJRNQkogr+RuqCSPTq65ha4WKlRGWkMFybzVH
NloxC+aU3lgp/NlX9yUtfqYmJek1CDrOOGPrAEAwj1l/BUeYKNGqfBWYJQtPJu+5
OaSvIYGpETCZJscUWODmLEb/O3DM438vLvxonwGqXqS0KX37+CHpUlyhnSovxXxp
Pz4aF+L7OtczxL0GYtD2fR9B7TDMqsNmHXgQrixvvOY7MUdLGbd4RfJL3yA53hyO
xzfKY2TzxLiOmctG0hXFkH5J
-----END X509 CRL-----
)";

  bssl::UniquePtr<BIO> bio(BIO_new_mem_buf(kCRL1, strlen(kCRL1)));
  ASSERT_TRUE(bio);
  bssl::UniquePtr<X509_CRL> crl1(
      PEM_read_bio_X509_CRL(bio.get(), nullptr, nullptr, nullptr));
  ASSERT_TRUE(crl1);
  bio.reset(BIO_new_mem_buf(kCRL2, strlen(kCRL2)));
  ASSERT_TRUE(bio);
  bssl::UniquePtr<X509_CRL> crl2(
      PEM_read_bio_X509_CRL(bio.get(), nullptr, nullptr, nullptr));
  ASSERT_TRUE(crl2);

  // DER's SET OF ordering sorts by tag, then length, so |crl1| comes before
  // |crl2|.
  auto check_order = [&](X509_CRL *new_crl1, X509_CRL *new_crl2) {
    // Bundle the CRLs in the new order.
    bssl::UniquePtr<STACK_OF(X509_CRL)> new_crls(sk_X509_CRL_new_null());
    ASSERT_TRUE(new_crls);
    ASSERT_TRUE(bssl::PushToStack(new_crls.get(), bssl::UpRef(new_crl1)));
    ASSERT_TRUE(bssl::PushToStack(new_crls.get(), bssl::UpRef(new_crl2)));
    bssl::ScopedCBB cbb;
    ASSERT_TRUE(CBB_init(cbb.get(), 64));
    ASSERT_TRUE(PKCS7_bundle_CRLs(cbb.get(), new_crls.get()));

    // The bundle should be sorted back to the original order.
    CBS cbs;
    CBS_init(&cbs, CBB_data(cbb.get()), CBB_len(cbb.get()));
    bssl::UniquePtr<STACK_OF(X509_CRL)> result(sk_X509_CRL_new_null());
    ASSERT_TRUE(result);
    ASSERT_TRUE(PKCS7_get_CRLs(result.get(), &cbs));
    ASSERT_EQ(2u, sk_X509_CRL_num(result.get()));
    EXPECT_EQ(0, X509_CRL_cmp(crl1.get(), sk_X509_CRL_value(result.get(), 0)));
    EXPECT_EQ(0, X509_CRL_cmp(crl2.get(), sk_X509_CRL_value(result.get(), 1)));
  };

  check_order(crl1.get(), crl2.get());
  check_order(crl2.get(), crl1.get());
}